

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webserver.c
# Opt level: O0

int get_file_info(char *filename,UpnpFileInfo *info)

{
  int iVar1;
  off_t oVar2;
  tm *__tp;
  char *pcVar3;
  char local_128 [8];
  char buffer [26];
  undefined1 local_100 [8];
  tm date;
  time_t aux_LastModified;
  int rc;
  int fd;
  FILE *fp;
  stat s;
  int code;
  UpnpFileInfo *info_local;
  char *filename_local;
  
  UpnpFileInfo_set_ContentType(info,(char *)0x0);
  _rc = fopen(filename,"r");
  UpnpFileInfo_set_IsReadable(info,(uint)(_rc != (FILE *)0x0));
  if (_rc == (FILE *)0x0) {
    aux_LastModified._0_4_ = -1;
  }
  else {
    iVar1 = fileno(_rc);
    if (iVar1 == -1) {
      aux_LastModified._0_4_ = -1;
    }
    else {
      s.__glibc_reserved[2]._4_4_ = fstat(iVar1,(stat *)&fp);
      if (s.__glibc_reserved[2]._4_4_ == -1) {
        aux_LastModified._0_4_ = -1;
      }
      else {
        fclose(_rc);
        _rc = (FILE *)0x0;
        if (((uint)s.st_nlink & 0xf000) == 0x4000) {
          UpnpFileInfo_set_IsDirectory(info,1);
        }
        else {
          if (((uint)s.st_nlink & 0xf000) != 0x8000) {
            aux_LastModified._0_4_ = -1;
            goto LAB_00126680;
          }
          UpnpFileInfo_set_IsDirectory(info,0);
        }
        UpnpFileInfo_set_FileLength(info,s.st_rdev);
        UpnpFileInfo_set_LastModified(info,s.st_atim.tv_nsec);
        aux_LastModified._0_4_ = get_content_type(filename,info);
        date.tm_zone = (char *)UpnpFileInfo_get_LastModified(info);
        oVar2 = UpnpFileInfo_get_FileLength(info);
        __tp = gmtime_r((time_t *)&date.tm_zone,(tm *)local_100);
        pcVar3 = asctime_r(__tp,local_128);
        iVar1 = UpnpFileInfo_get_IsReadable(info);
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/webserver.c",0x244,
                   "file info: %s, length: %ld, last_mod=%s readable=%d\n",filename,oVar2,pcVar3,
                   iVar1);
      }
    }
  }
LAB_00126680:
  if (_rc != (FILE *)0x0) {
    fclose(_rc);
  }
  return (int)aux_LastModified;
}

Assistant:

static int get_file_info(
	/*! [in] Filename having the description document. */
	const char *filename,
	/*! [out] File information object having file attributes such as
	 * filelength, when was the file last modified, whether a file or a
	 * directory and whether the file or directory is readable. */
	UpnpFileInfo *info)
{
	int code;
	struct stat s;
	FILE *fp;
	int fd;
	int rc = 0;
	time_t aux_LastModified;
	struct tm date;
	char buffer[ASCTIME_R_BUFFER_SIZE];

	UpnpFileInfo_set_ContentType(info, NULL);
	#ifdef _WIN32
	fopen_s(&fp, filename, "r");
	#else
	fp = fopen(filename, "r");
	#endif
	/* check readable */
	UpnpFileInfo_set_IsReadable(info, fp != NULL);
	if (!fp) {
		rc = -1;
		goto exit_function;
	}
	fd = fileno(fp);
	if (fd == -1) {
		rc = -1;
		goto exit_function;
	}
	code = fstat(fd, &s);
	if (code == -1) {
		rc = -1;
		goto exit_function;
	}
	fclose(fp);
	fp = NULL;
	if (S_ISDIR(s.st_mode)) {
		UpnpFileInfo_set_IsDirectory(info, 1);
	} else if (S_ISREG(s.st_mode)) {
		UpnpFileInfo_set_IsDirectory(info, 0);
	} else {
		rc = -1;
		goto exit_function;
	}
	UpnpFileInfo_set_FileLength(info, s.st_size);
	UpnpFileInfo_set_LastModified(info, s.st_mtime);
	rc = get_content_type(filename, info);
	aux_LastModified = UpnpFileInfo_get_LastModified(info);
	UpnpPrintf(UPNP_INFO,
		HTTP,
		__FILE__,
		__LINE__,
		"file info: %s, length: %" PRId64 ", last_mod=%s readable=%d\n",
		filename,
		(int64_t)UpnpFileInfo_get_FileLength(info),
		web_server_asctime_r(
			http_gmtime_r(&aux_LastModified, &date), buffer),
		UpnpFileInfo_get_IsReadable(info));

exit_function:
	if (fp) {
		fclose(fp);
	}
	return rc;
}